

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

action_t helics::getMatchAction(InterfaceType type,InterfaceType destType)

{
  InterfaceType destType_local;
  InterfaceType type_local;
  undefined4 local_4;
  
  if (type == FILTER) {
    local_4 = cmd_add_endpoint;
  }
  else if (type == INPUT) {
    local_4 = cmd_add_publisher;
  }
  else if (type == PUBLICATION) {
    local_4 = cmd_add_subscriber;
  }
  else {
    local_4 = cmd_add_endpoint;
    if (destType == FILTER) {
      local_4 = cmd_add_filter;
    }
  }
  return local_4;
}

Assistant:

static action_message_def::action_t getMatchAction(InterfaceType type, InterfaceType destType)
{
    switch (type) {
        case InterfaceType::FILTER:
            return CMD_ADD_ENDPOINT;
        case InterfaceType::PUBLICATION:
            return CMD_ADD_SUBSCRIBER;
        case InterfaceType::INPUT:
            return CMD_ADD_PUBLISHER;
        default:
            return (destType == InterfaceType::FILTER) ? CMD_ADD_FILTER : CMD_ADD_ENDPOINT;
    }
}